

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov1detection.cpp
# Opt level: O3

int __thiscall ncnn::Yolov1Detection::load_param(Yolov1Detection *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  
  iVar1 = ParamDict::get(pd,0,7);
  this->side = iVar1;
  iVar1 = ParamDict::get(pd,1,0x14);
  this->classes = iVar1;
  iVar1 = ParamDict::get(pd,2,5);
  this->box_num = iVar1;
  iVar1 = ParamDict::get(pd,3,1);
  this->sqrt_enable = iVar1;
  iVar1 = ParamDict::get(pd,4,1);
  this->softmax_enable = iVar1;
  fVar2 = ParamDict::get(pd,5,0.25);
  this->confidence_threshold = fVar2;
  fVar2 = ParamDict::get(pd,6,0.45);
  this->nms_threshold = fVar2;
  return 0;
}

Assistant:

int Yolov1Detection::load_param(const ParamDict &pd)
{
    side = pd.get(0, 7);
    classes = pd.get(1, 20);
    box_num = pd.get(2, 5);
    sqrt_enable = pd.get(3, 1);
    softmax_enable = pd.get(4, 1);
    confidence_threshold = pd.get(5, 0.25f);
    nms_threshold = pd.get(6, 0.45f);

    return 0;
}